

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

FILE * drwav_fopen(char *filePath,char *openMode)

{
  char *in_RSI;
  char *in_RDI;
  FILE *pFile;
  FILE *local_8;
  
  local_8 = fopen(in_RDI,in_RSI);
  if (local_8 == (FILE *)0x0) {
    local_8 = (FILE *)0x0;
  }
  return (FILE *)local_8;
}

Assistant:

FILE* drwav_fopen(const char* filePath, const char* openMode)
{
    FILE* pFile;
#if defined(_MSC_VER) && _MSC_VER >= 1400
    if (fopen_s(&pFile, filePath, openMode) != 0) {
        return DRWAV_FALSE;
    }
#else
    pFile = fopen(filePath, openMode);
    if (pFile == NULL) {
        return DRWAV_FALSE;
    }
#endif

    return pFile;
}